

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_predict.c
# Opt level: O0

int TIFFPredictorCleanup(TIFF *tif)

{
  uint8_t *puVar1;
  TIFFPredictorState *sp;
  TIFF *tif_local;
  
  puVar1 = tif->tif_data;
  if (puVar1 != (uint8_t *)0x0) {
    (tif->tif_tagmethods).vgetfield = *(TIFFVGetMethod *)(puVar1 + 0x58);
    (tif->tif_tagmethods).vsetfield = *(TIFFVSetMethod *)(puVar1 + 0x60);
    (tif->tif_tagmethods).printdir = *(TIFFPrintMethod *)(puVar1 + 0x68);
    tif->tif_setupdecode = *(TIFFBoolMethod *)(puVar1 + 0x70);
    tif->tif_setupencode = *(TIFFBoolMethod *)(puVar1 + 0x78);
    return 1;
  }
  __assert_fail("sp != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_predict.c"
                ,0x40d,"int TIFFPredictorCleanup(TIFF *)");
}

Assistant:

int TIFFPredictorCleanup(TIFF *tif)
{
    TIFFPredictorState *sp = PredictorState(tif);

    assert(sp != 0);

    tif->tif_tagmethods.vgetfield = sp->vgetparent;
    tif->tif_tagmethods.vsetfield = sp->vsetparent;
    tif->tif_tagmethods.printdir = sp->printdir;
    tif->tif_setupdecode = sp->setupdecode;
    tif->tif_setupencode = sp->setupencode;

    return 1;
}